

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O3

void __thiscall ConductorBRDF::ConductorBRDF(ConductorBRDF *this,string *name)

{
  size_t sVar1;
  size_t __n;
  float fVar2;
  int iVar3;
  undefined8 *puVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ComplexIorData *pCVar8;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x16a980;
  *(undefined8 *)&this->field_0x28 = 0x16a9c8;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0x16a9a0;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  (this->k).y = 0.0;
  (this->k).z = 0.0;
  *(undefined4 *)&this->field_0x30 = 3;
  bVar5 = false;
  lVar6 = 0;
  do {
    sVar1 = name->_M_string_length;
    lVar7 = lVar6 + 1;
    pCVar8 = complexIorList + lVar6;
    while ((__n = (pCVar8->name)._M_string_length, __n != sVar1 ||
           ((__n != 0 &&
            (iVar3 = bcmp((pCVar8->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar3 != 0)
            )))) {
      lVar7 = lVar7 + 1;
      pCVar8 = pCVar8 + 1;
      if (lVar7 == 0x29) {
        if (bVar5) {
          return;
        }
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "conductor material not found";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
    }
    *(float *)&this->field_0x18 = (pCVar8->eta).z;
    fVar2 = (pCVar8->eta).y;
    *(float *)&(this->super_BRDF).field_0x10 = (pCVar8->eta).x;
    *(float *)&(this->super_BRDF).field_0x14 = fVar2;
    (this->k).z = (pCVar8->k).z;
    fVar2 = (pCVar8->k).y;
    (this->k).x = (pCVar8->k).x;
    (this->k).y = fVar2;
    bVar5 = true;
    lVar6 = lVar7;
  } while (lVar7 != 0x28);
  return;
}

Assistant:

ConductorBRDF(std::string name)
	{
		flags = Type(DIRAC | REFLECT);
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
	}